

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeBuilder.cpp
# Opt level: O0

void __thiscall OctreeBuilder::create_buffers(OctreeBuilder *this,shared_ptr<myvk::Device> *device)

{
  uint32_t uVar1;
  element_type *peVar2;
  uint *puVar3;
  element_type *this_00;
  anon_class_1_0_00000001 *in_RSI;
  uint32_t octree_entry_num;
  uint32_t octree_node_ratio;
  shared_ptr<myvk::Buffer> *psVar4;
  shared_ptr<myvk::Buffer> *in_stack_fffffffffffffe50;
  shared_ptr<myvk::Buffer> *psVar5;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffe60;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *this_01;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 uVar6;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe88;
  VkDeviceSize in_stack_fffffffffffffe90;
  VmaMemoryUsage VVar7;
  undefined8 *count;
  Ptr<Device> *in_stack_fffffffffffffe98;
  Ptr<Device> *device_00;
  VkDeviceSize in_stack_fffffffffffffea0;
  Ptr<Device> *in_stack_fffffffffffffea8;
  anon_class_1_0_00000001 *device_01;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffec0;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *access_queues;
  shared_ptr<myvk::Buffer> local_118;
  undefined8 local_108;
  shared_ptr<myvk::Buffer> local_f8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_b8 [24];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined1 local_88 [16];
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_78;
  Ptr<Device> local_58 [2];
  shared_ptr<myvk::Buffer> local_38;
  undefined8 local_28;
  anon_class_1_0_00000001 *local_10;
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
  local_38.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_38.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = 0;
  psVar4 = &local_38;
  local_10 = in_RSI;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1555b3);
  myvk::Buffer::Create
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffe98 >> 0x20),
             (VkBufferUsageFlags)in_stack_fffffffffffffe98,
             (VmaMemoryUsage)(in_stack_fffffffffffffe90 >> 0x20),in_stack_fffffffffffffec0);
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffe50,psVar4);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x155616);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (in_stack_fffffffffffffe60);
  local_78.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  access_queues = &local_78;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x155659);
  myvk::Buffer::
  CreateStaging<unsigned_int,OctreeBuilder::create_buffers(std::shared_ptr<myvk::Device>const&)::__0>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (bool)uVar6,in_stack_fffffffffffffe78);
  VVar7 = (VmaMemoryUsage)(in_stack_fffffffffffffe90 >> 0x20);
  device_00 = local_58;
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffe50,psVar4);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x1556b0);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (in_stack_fffffffffffffe60);
  local_b8._16_8_ = (pointer)0x0;
  uStack_a0 = 0;
  local_98 = 0;
  psVar4 = (shared_ptr<myvk::Buffer> *)(local_b8 + 0x10);
  device_01 = local_10;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1556f3);
  psVar5 = psVar4;
  myvk::Buffer::Create
            ((Ptr<Device> *)device_01,(VkDeviceSize)psVar4,
             (VmaAllocationCreateFlags)((ulong)device_00 >> 0x20),(VkBufferUsageFlags)device_00,
             VVar7,access_queues);
  uVar6 = (undefined1)((ulong)local_88 >> 0x38);
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffe50,psVar4);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x155750);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (in_stack_fffffffffffffe60);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  count = &local_d8;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x155793);
  myvk::Buffer::
  CreateStaging<unsigned_int,OctreeBuilder::create_buffers(std::shared_ptr<myvk::Device>const&)::__1>
            (device_00,(VkDeviceSize)count,local_10,(bool)uVar6,in_stack_fffffffffffffe78);
  VVar7 = (VmaMemoryUsage)((ulong)count >> 0x20);
  this_01 = (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            local_b8;
  std::shared_ptr<myvk::Buffer>::operator=(in_stack_fffffffffffffe50,psVar4);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x1557ea);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (this_01);
  peVar2 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x155804);
  uVar1 = Voxelizer::GetLevel(peVar2);
  local_dc = uVar1 / 3;
  peVar2 = std::__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Voxelizer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x15582f);
  uVar1 = Voxelizer::GetVoxelFragmentCount(peVar2);
  local_e4 = uVar1 * local_dc;
  puVar3 = std::max<unsigned_int>(&kOctreeNodeNumMin,&local_e4);
  local_e0 = *puVar3;
  puVar3 = std::min<unsigned_int>(&local_e0,&kOctreeNodeNumMax);
  local_e0 = *puVar3;
  local_118.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_118.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108 = 0;
  psVar4 = &local_118;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1558c8);
  myvk::Buffer::Create
            ((Ptr<Device> *)device_01,(VkDeviceSize)psVar5,
             (VmaAllocationCreateFlags)((ulong)device_00 >> 0x20),(VkBufferUsageFlags)device_00,
             VVar7,access_queues);
  psVar5 = &local_f8;
  std::shared_ptr<myvk::Buffer>::operator=(psVar5,psVar4);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x15592a);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (this_01);
  this_00 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x155941);
  myvk::BufferBase::GetSize(&this_00->super_BufferBase);
  spdlog::info<char[44],unsigned_int&,double>
            ((char (*) [44])psVar5,(uint *)psVar4,(double *)0x1559a1);
  return;
}

Assistant:

void OctreeBuilder::create_buffers(const std::shared_ptr<myvk::Device> &device) {
	m_build_info_buffer = myvk::Buffer::Create(device, 2 * sizeof(uint32_t), 0,
	                                           VK_BUFFER_USAGE_STORAGE_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_build_info_staging_buffer = myvk::Buffer::CreateStaging<uint32_t>(device, 2, [](uint32_t *data) {
		data[0] = 0; // uAllocBegin
		data[1] = 8; // uAllocNum
	});

	m_indirect_buffer = myvk::Buffer::Create(device, 3 * sizeof(uint32_t), 0,
	                                         VK_BUFFER_USAGE_STORAGE_BUFFER_BIT | VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT |
	                                             VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_indirect_staging_buffer = myvk::Buffer::CreateStaging<uint32_t>(device, 3, [](uint32_t *data) {
		data[0] = 1; // uGroupX
		data[1] = 1; // uGroupY
		data[2] = 1; // uGroupZ
	});

	// Estimate octree buffer size
	uint32_t octree_node_ratio = m_voxelizer_ptr->GetLevel() / 3;
	uint32_t octree_entry_num =
	    std::max(kOctreeNodeNumMin, m_voxelizer_ptr->GetVoxelFragmentCount() * octree_node_ratio);
	octree_entry_num = std::min(octree_entry_num, kOctreeNodeNumMax);

	m_octree_buffer =
	    myvk::Buffer::Create(device, octree_entry_num * sizeof(uint32_t), 0, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
	spdlog::info("Octree buffer created with {} nodes ({} MB)", octree_entry_num,
	             m_octree_buffer->GetSize() / 1000000.0);
}